

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void get_order_then_remap
               (int size,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *_edges,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  bool bVar1;
  reference ppVar2;
  pair<int,_int> local_70;
  reference local_68;
  pair<int,_int> *e_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  int i_1;
  int i;
  pair<int,_int> *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *_edges_local;
  int size_local;
  
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(_edges);
  e = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(_edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&e);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1);
    order[ppVar2->first].second = order[ppVar2->first].second + 1;
    order[ppVar2->second].second = order[ppVar2->second].second + 1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  for (__range1_1._4_4_ = 0; __range1_1._4_4_ < size; __range1_1._4_4_ = __range1_1._4_4_ + 1) {
    order[__range1_1._4_4_].first = __range1_1._4_4_;
  }
  std::sort<std::pair<int,int>*,int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>
            (order,order + size,cmp_order);
  for (__range1_1._0_4_ = 0; (int)__range1_1 < size; __range1_1._0_4_ = (int)__range1_1 + 1) {
    ord_map[order[(int)__range1_1].first] = (int)__range1_1;
  }
  __end1_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(_edges);
  e_1 = (pair<int,_int> *)
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(_edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)&e_1);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end1_1);
    local_70 = std::make_pair<int&,int&>(ord_map + local_68->first,ord_map + local_68->second);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (edges,&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void get_order_then_remap(int size, const vector<pair<int, int> > &_edges, vector<pair<int, int> > &edges) {
    /* get the order by degree */
    for (auto &e: _edges) {
        ++order[e.first].second;
        ++order[e.second].second;
    }
    for (int i = 0; i < size; ++i) order[i].first = i;
    sort(order, order + size, cmp_order);

    /* remap vertex */
    for (int i = 0; i < size; ++i) ord_map[order[i].first] = i;
    for (auto &e: _edges) {
        edges.push_back(make_pair(ord_map[e.first], ord_map[e.second]));
    }
}